

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  _Rb_tree_node_base *info;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr *pp_Var8;
  bool bVar9;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string base;
  string ruleFileName;
  string ruleFileNameFull;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  cmGeneratedFileStream ruleFileStream;
  long *local_360 [2];
  long local_350 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  _Rb_tree_node_base *local_320;
  string local_318;
  string local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Makefile","");
  ConvertToFullPath(&local_2f8,this,&local_318);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,local_2f8._M_dataplus._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    if ((this->super_cmLocalGenerator).Parent != (cmLocalGenerator *)0x0) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
    }
    WriteLocalAllRules(this,(ostream *)local_278);
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2a8._M_impl.super__Rb_tree_header._M_header;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((this->super_cmLocalGenerator).Parent == (cmLocalGenerator *)0x0) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)(this->super_cmLocalGenerator).GlobalGenerator,
                 (ostream *)local_278,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2a8);
    }
    else {
      WriteLocalMakefileTargets
                (this,(ostream *)local_278,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2a8);
    }
    bVar2 = this->SkipPreprocessedSourceRules;
    bVar3 = this->SkipAssemblySourceRules;
    p_Var1 = &local_2d8._M_impl.super__Rb_tree_header;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    GetLocalObjectFiles(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                              *)&local_2d8);
    if ((_Rb_tree_header *)local_2d8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var6 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        info = p_Var6 + 2;
        WriteObjectConvenienceRule
                  (this,(ostream *)local_278,"target to build an object file",*(char **)(p_Var6 + 1)
                   ,(LocalObjectInfo *)info);
        local_320 = p_Var6 + 1;
        for (p_Var7 = *(_Base_ptr *)(p_Var6 + 2); bVar9 = p_Var7 != p_Var6[2]._M_parent, bVar9;
            p_Var7 = (_Base_ptr)&p_Var7[1]._M_parent) {
          pp_Var8 = &p_Var7->_M_parent;
          iVar5 = std::__cxx11::string::compare((char *)pp_Var8);
          if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)pp_Var8), iVar5 == 0))
             || (iVar5 = std::__cxx11::string::compare((char *)pp_Var8), iVar5 == 0)) {
            p_Var4 = local_320;
            if (bVar2 == false) {
              std::__cxx11::string::rfind((char *)local_320,0x503179,0xffffffffffffffff);
              std::__cxx11::string::substr((ulong)&local_340,(ulong)p_Var4);
              local_360[0] = local_350;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_360,local_340._M_dataplus._M_p,
                         local_340._M_dataplus._M_p + local_340._M_string_length);
              std::__cxx11::string::append((char *)local_360);
              WriteObjectConvenienceRule
                        (this,(ostream *)local_278,"target to preprocess a source file",
                         (char *)local_360[0],(LocalObjectInfo *)info);
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              *(undefined1 *)((long)&p_Var6[2]._M_right + 1) = 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != &local_340.field_2) {
                operator_delete(local_340._M_dataplus._M_p,
                                local_340.field_2._M_allocated_capacity + 1);
              }
            }
            break;
          }
        }
        p_Var4 = local_320;
        if ((bVar9) && (bVar3 == false)) {
          std::__cxx11::string::rfind((char *)local_320,0x503179,0xffffffffffffffff);
          std::__cxx11::string::substr((ulong)&local_340,(ulong)p_Var4);
          local_360[0] = local_350;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_360,local_340._M_dataplus._M_p,
                     local_340._M_dataplus._M_p + local_340._M_string_length);
          std::__cxx11::string::append((char *)local_360);
          WriteObjectConvenienceRule
                    (this,(ostream *)local_278,"target to generate assembly for a file",
                     (char *)local_360[0],(LocalObjectInfo *)info);
          if (local_360[0] != local_350) {
            operator_delete(local_360[0],local_350[0] + 1);
          }
          *(undefined1 *)((long)&p_Var6[2]._M_right + 2) = 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_2d8._M_impl.super__Rb_tree_header);
    }
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"help","");
    pVar10 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&local_2a8,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)(this->super_cmLocalGenerator).GlobalGenerator,
                 (ostream *)local_278,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)local_278);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~_Rb_tree(&local_2d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(ruleFileNameFull.c_str());
  if(!ruleFileStream)
    {
    return;
    }
  // always write the top makefile
  if (this->Parent)
    {
    ruleFileStream.SetCopyIfDifferent(true);
    }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (this->Parent)
    {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream,emittedTargets);
    }
  else
    {
    cmGlobalUnixMakefileGenerator3 *gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream,emittedTargets);
    }

  bool do_preprocess_rules =
    this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules =
    this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (std::map<std::string, LocalObjectInfo>::iterator lo =
         localObjectFiles.begin();
       lo != localObjectFiles.end(); ++lo)
    {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(ruleFileStream,
                                     "target to build an object file",
                                     lo->first.c_str(), lo->second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for(std::vector<LocalObjectEntry>::const_iterator ei =
          lo->second.begin(); ei != lo->second.end(); ++ei)
      {
      if(ei->Language == "C" ||
         ei->Language == "CXX" ||
         ei->Language == "Fortran")
        {
        // Right now, C, C++ and Fortran have both a preprocessor and the
        // ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
        }
      }

    // Add convenience rules for preprocessed and assembly files.
    if(lang_has_preprocessor && do_preprocess_rules)
      {
      std::string::size_type dot_pos = lo->first.rfind(".");
      std::string base = lo->first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to preprocess a source file",
       (base + ".i").c_str(), lo->second);
      lo->second.HasPreprocessRule = true;
      }

    if(lang_has_assembly && do_assembly_rules)
      {
      std::string::size_type dot_pos = lo->first.rfind(".");
      std::string base = lo->first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
       ruleFileStream, "target to generate assembly for a file",
       (base + ".s").c_str(), lo->second);
      lo->second.HasAssembleRule = true;
      }
    }

  // add a help target as long as there isn;t a real target named help
  if(emittedTargets.insert("help").second)
    {
    cmGlobalUnixMakefileGenerator3 *gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream,this);
    }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}